

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

void secp256k1_ecdsa_signature_save
               (secp256k1_ecdsa_signature *sig,secp256k1_scalar *r,secp256k1_scalar *s)

{
  secp256k1_scalar_get_b32(sig->data,r);
  secp256k1_scalar_get_b32(sig->data + 0x20,s);
  return;
}

Assistant:

static void secp256k1_ecdsa_signature_save(secp256k1_ecdsa_signature* sig, const secp256k1_scalar* r, const secp256k1_scalar* s) {
    if (sizeof(secp256k1_scalar) == 32) {
        memcpy(&sig->data[0], r, 32);
        memcpy(&sig->data[32], s, 32);
    } else {
        secp256k1_scalar_get_b32(&sig->data[0], r);
        secp256k1_scalar_get_b32(&sig->data[32], s);
    }
}